

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XIncludeUtils.cpp
# Opt level: O0

bool __thiscall
xercesc_4_0::XIncludeUtils::isInCurrentInclusionHistoryStack(XIncludeUtils *this,XMLCh *toFind)

{
  bool bVar1;
  XIncludeHistoryNode *local_28;
  XIncludeHistoryNode *historyCursor;
  XMLCh *toFind_local;
  XIncludeUtils *this_local;
  
  local_28 = this->fIncludeHistoryHead;
  while( true ) {
    if (local_28 == (XIncludeHistoryNode *)0x0) {
      return false;
    }
    bVar1 = XMLString::equals(toFind,local_28->URI);
    if (bVar1) break;
    local_28 = local_28->next;
  }
  return true;
}

Assistant:

bool
XIncludeUtils::isInCurrentInclusionHistoryStack(const XMLCh *toFind){
    XIncludeHistoryNode *historyCursor = fIncludeHistoryHead;
    /* walk the list */
    while (historyCursor != NULL){
        if (XMLString::equals(toFind, historyCursor->URI)){
            return true;
        }
        historyCursor = historyCursor->next;
    }
    return false;
}